

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

int __thiscall glslang::TType::computeNumComponents(TType *this)

{
  bool bVar1;
  int iVar2;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar3;
  reference pTVar4;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_28;
  __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_20;
  const_iterator tl;
  uint32_t components;
  TType *this_local;
  
  tl._M_current._4_4_ = 0;
  bVar1 = isCoopVecNV(this);
  if (bVar1) {
    tl._M_current._4_4_ = TArraySizes::getDimSize(this->typeParameters->arraySizes,0);
  }
  else {
    iVar2 = (*this->_vptr_TType[7])();
    if ((iVar2 == 0xf) || (iVar2 = (*this->_vptr_TType[7])(), iVar2 == 0x10)) {
      pvVar3 = &getStruct(this)->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      local_20._M_current =
           (TTypeLoc *)
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                     (pvVar3);
      while( true ) {
        pvVar3 = &getStruct(this)->
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        local_28._M_current =
             (TTypeLoc *)
             std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                       (pvVar3);
        bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
        if (!bVar1) break;
        pTVar4 = __gnu_cxx::
                 __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator*(&local_20);
        iVar2 = computeNumComponents(pTVar4->type);
        tl._M_current._4_4_ = iVar2 + tl._M_current._4_4_;
        __gnu_cxx::
        __normal_iterator<const_glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
        ::operator++(&local_20,0);
      }
    }
    else if ((*(uint *)&this->field_0x8 >> 0xc & 0xf) == 0) {
      tl._M_current._4_4_ = *(uint *)&this->field_0x8 >> 8 & 0xf;
    }
    else {
      tl._M_current._4_4_ =
           (*(uint *)&this->field_0x8 >> 0xc & 0xf) * (*(uint *)&this->field_0x8 >> 0x10 & 0xf);
    }
  }
  if (this->arraySizes != (TArraySizes *)0x0) {
    iVar2 = TArraySizes::getCumulativeSize(this->arraySizes);
    tl._M_current._4_4_ = iVar2 * tl._M_current._4_4_;
  }
  return tl._M_current._4_4_;
}

Assistant:

int computeNumComponents() const
    {
        uint32_t components = 0;

        if (isCoopVecNV()) {
            components = typeParameters->arraySizes->getDimSize(0);
        } else if (getBasicType() == EbtStruct || getBasicType() == EbtBlock) {
            for (TTypeList::const_iterator tl = getStruct()->begin(); tl != getStruct()->end(); tl++)
                components += ((*tl).type)->computeNumComponents();
        } else if (matrixCols)
            components = matrixCols * matrixRows;
        else
            components = vectorSize;

        if (arraySizes != nullptr) {
            components *= arraySizes->getCumulativeSize();
        }

        return static_cast<int>(components);
    }